

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knetfile.c
# Opt level: O0

int kftp_get_response(knetFile *ftp)

{
  int iVar1;
  ssize_t sVar2;
  char *pcVar3;
  ushort **ppuVar4;
  long lVar5;
  int local_2c;
  char *local_28;
  char *p;
  int n;
  uchar c;
  knetFile *ftp_local;
  
  p._0_4_ = 0;
  _n = ftp;
  iVar1 = socket_wait(ftp->ctrl_fd,1);
  if (iVar1 < 1) {
    ftp_local._4_4_ = 0;
  }
  else {
    while (sVar2 = read(_n->ctrl_fd,(void *)((long)&p + 7),1), sVar2 != 0) {
      if (_n->max_response <= (int)p) {
        if (_n->max_response == 0) {
          local_2c = 0x100;
        }
        else {
          local_2c = _n->max_response << 1;
        }
        _n->max_response = local_2c;
        pcVar3 = (char *)realloc(_n->response,(long)_n->max_response);
        _n->response = pcVar3;
      }
      iVar1 = (int)p + 1;
      _n->response[(int)p] = p._7_1_;
      p._0_4_ = iVar1;
      if (p._7_1_ == '\n') {
        if ((((3 < iVar1) &&
             (ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[(int)*_n->response] & 0x800) != 0)) &&
            (ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[(int)_n->response[1]] & 0x800) != 0)) &&
           ((ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[(int)_n->response[2]] & 0x800) != 0 &&
            (_n->response[3] != '-')))) break;
        p._0_4_ = 0;
      }
    }
    if ((int)p < 2) {
      ftp_local._4_4_ = -1;
    }
    else {
      _n->response[(int)p + -2] = '\0';
      lVar5 = strtol(_n->response,&local_28,0);
      ftp_local._4_4_ = (int)lVar5;
    }
  }
  return ftp_local._4_4_;
}

Assistant:

static int kftp_get_response(knetFile *ftp)
{
#ifndef _WIN32
	unsigned char c;
#else
	char c;
#endif
	int n = 0;
	char *p;
	if (socket_wait(ftp->ctrl_fd, 1) <= 0) return 0;
	while (netread(ftp->ctrl_fd, &c, 1)) { // FIXME: this is *VERY BAD* for unbuffered I/O
		//fputc(c, stderr);
		if (n >= ftp->max_response) {
			ftp->max_response = ftp->max_response? ftp->max_response<<1 : 256;
			ftp->response = (char*)realloc(ftp->response, ftp->max_response);
		}
		ftp->response[n++] = c;
		if (c == '\n') {
			if (n >= 4 && isdigit(ftp->response[0]) && isdigit(ftp->response[1]) && isdigit(ftp->response[2])
				&& ftp->response[3] != '-') break;
			n = 0;
			continue;
		}
	}
	if (n < 2) return -1;
	ftp->response[n-2] = 0;
	return strtol(ftp->response, &p, 0);
}